

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_binary_func_op_cast_clustered
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op,BaseType input_type)

{
  uint32_t result_type_00;
  bool forwarding;
  SPIRType *pSVar1;
  uint32_t uVar2;
  undefined1 local_270 [64];
  undefined1 local_230 [64];
  string local_1f0 [32];
  string local_1d0 [8];
  string expr;
  undefined1 local_1a0 [8];
  string cast_op0;
  undefined1 local_180 [8];
  SPIRType expected_type;
  SPIRType *out_type;
  char *op_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  out_type = (SPIRType *)op;
  op_local._0_4_ = op1;
  op_local._4_4_ = op0;
  op1_local = result_id;
  op0_local = result_type;
  _result_id_local = this;
  expected_type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  SPIRType::SPIRType((SPIRType *)local_180,
                     (SPIRType *)expected_type.member_name_cache._M_h._M_single_bucket);
  expected_type.super_IVariant._vptr_IVariant._4_4_ = input_type;
  pSVar1 = Compiler::expression_type(&this->super_Compiler,op_local._4_4_);
  uVar2 = (uint32_t)this;
  if (*(BaseType *)&(pSVar1->super_IVariant).field_0xc == input_type) {
    to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_1a0,uVar2,SUB41(op_local._4_4_,0));
  }
  else {
    bitcast_glsl_abi_cxx11_((CompilerGLSL *)local_1a0,(SPIRType *)this,(uint32_t)local_180);
  }
  ::std::__cxx11::string::string(local_1d0);
  if (*(BaseType *)((long)&expected_type.member_name_cache._M_h._M_single_bucket[1]._M_nxt + 4) ==
      input_type) {
    to_expression_abi_cxx11_((CompilerGLSL *)local_270,uVar2,SUB41((uint32_t)op_local,0));
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
              ((spirv_cross *)(local_270 + 0x20),(char **)&out_type,(char (*) [2])0x4f3f9c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
               (char (*) [3])0x4f06f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270,
               (char (*) [2])0x4dff7a);
    ::std::__cxx11::string::operator+=(local_1d0,(string *)(local_270 + 0x20));
    ::std::__cxx11::string::~string((string *)(local_270 + 0x20));
    ::std::__cxx11::string::~string((string *)local_270);
  }
  else {
    (*(this->super_Compiler)._vptr_Compiler[0x34])
              (local_1f0,this,expected_type.member_name_cache._M_h._M_single_bucket,local_180);
    ::std::__cxx11::string::operator=(local_1d0,local_1f0);
    ::std::__cxx11::string::~string(local_1f0);
    ::std::__cxx11::string::operator+=(local_1d0,'(');
    to_expression_abi_cxx11_((CompilerGLSL *)local_230,uVar2,SUB41((uint32_t)op_local,0));
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
              ((spirv_cross *)(local_230 + 0x20),(char **)&out_type,(char (*) [2])0x4f3f9c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
               (char (*) [3])0x4f06f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
               (char (*) [2])0x4dff7a);
    ::std::__cxx11::string::operator+=(local_1d0,(string *)(local_230 + 0x20));
    ::std::__cxx11::string::~string((string *)(local_230 + 0x20));
    ::std::__cxx11::string::~string((string *)local_230);
    ::std::__cxx11::string::operator+=(local_1d0,')');
  }
  result_type_00 = op0_local;
  uVar2 = op1_local;
  forwarding = should_forward(this,op_local._4_4_);
  emit_op(this,result_type_00,uVar2,(string *)local_1d0,forwarding,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,op1_local,op_local._4_4_);
  ::std::__cxx11::string::~string(local_1d0);
  ::std::__cxx11::string::~string((string *)local_1a0);
  SPIRType::~SPIRType((SPIRType *)local_180);
  return;
}

Assistant:

void CompilerGLSL::emit_binary_func_op_cast_clustered(uint32_t result_type, uint32_t result_id, uint32_t op0,
                                                      uint32_t op1, const char *op, SPIRType::BaseType input_type)
{
	// Special purpose method for implementing clustered subgroup opcodes.
	// Main difference is that op1 does not participate in any casting, it needs to be a literal.
	auto &out_type = get<SPIRType>(result_type);
	auto expected_type = out_type;
	expected_type.basetype = input_type;
	string cast_op0 =
	    expression_type(op0).basetype != input_type ? bitcast_glsl(expected_type, op0) : to_unpacked_expression(op0);

	string expr;
	if (out_type.basetype != input_type)
	{
		expr = bitcast_glsl_op(out_type, expected_type);
		expr += '(';
		expr += join(op, "(", cast_op0, ", ", to_expression(op1), ")");
		expr += ')';
	}
	else
	{
		expr += join(op, "(", cast_op0, ", ", to_expression(op1), ")");
	}

	emit_op(result_type, result_id, expr, should_forward(op0));
	inherit_expression_dependencies(result_id, op0);
}